

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::createLightSource_infinite(SemanticParser *this,SP *in)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  element_type *peVar6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  ostream *poVar9;
  runtime_error *this_00;
  long *plVar10;
  size_type *psVar11;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *result;
  _Rb_tree_node_base *p_Var12;
  SP SVar13;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  string local_c8;
  string local_a8;
  SemanticParser *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_60;
  
  local_88 = this;
  std::__shared_ptr<pbrt::InfiniteLightSource,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::InfiniteLightSource>>
            ((__shared_ptr<pbrt::InfiniteLightSource,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             (allocator<pbrt::InfiniteLightSource> *)&local_60);
  lVar1 = *in_RDX;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x58);
  peVar3 = *(element_type **)(lVar1 + 0x60);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x68);
  peVar5 = *(element_type **)(lVar1 + 0x70);
  peVar6 = *(element_type **)(lVar1 + 0x80);
  (local_d8->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x78);
  (local_d8->pixelFilter).super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar6;
  (local_d8->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var4;
  (local_d8->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar5;
  (local_d8->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (local_d8->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  p_Var8 = *(_Rb_tree_node_base **)(*in_RDX + 0x20);
  p_Var12 = (_Rb_tree_node_base *)(*in_RDX + 0x10);
  if (p_Var8 != p_Var12) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_60,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var8 + 1));
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,local_60.first._M_dataplus._M_p,
                 local_60.first._M_dataplus._M_p + local_60.first._M_string_length);
      iVar7 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar7 == 0) {
        syntactic::ParamSet::getParamString(&local_c8,(ParamSet *)(*in_RDX + 8),&local_a8);
        std::__cxx11::string::operator=((string *)&local_d8->cameras,(string *)&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar7 == 0) {
          result = &(local_d8->pixelFilter).
                    super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)&local_a8);
          if (iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare((char *)&local_a8);
            if (iVar7 != 0) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_80,"unknown \'infinite\' light source param \'",&local_a8);
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_80);
              local_c8._M_dataplus._M_p = (pointer)*plVar10;
              psVar11 = (size_type *)(plVar10 + 2);
              if ((size_type *)local_c8._M_dataplus._M_p == psVar11) {
                local_c8.field_2._M_allocated_capacity = *psVar11;
                local_c8.field_2._8_8_ = plVar10[3];
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              }
              else {
                local_c8.field_2._M_allocated_capacity = *psVar11;
              }
              local_c8._M_string_length = plVar10[1];
              *plVar10 = (long)psVar11;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              std::runtime_error::runtime_error(this_00,(string *)&local_c8);
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            iVar7 = syntactic::ParamSet::getParam1i
                              ((ParamSet *)(*in_RDX + 8),&local_a8,
                               *(int *)&local_d8[1].super_Entity._vptr_Entity);
            *(int *)&local_d8[1].super_Entity._vptr_Entity = iVar7;
            goto LAB_00146f7e;
          }
          result = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(local_d8->world).
                           super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4);
        }
        syntactic::ParamSet::getParam3f((ParamSet *)(*in_RDX + 8),(float *)result,&local_a8);
      }
LAB_00146f7e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_60.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
        operator_delete(local_60.first._M_dataplus._M_p,
                        local_60.first.field_2._M_allocated_capacity + 1);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != p_Var12);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"found infinite light source w/ map ",0x23);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      (char *)(local_d8->cameras).
                              super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                      (long)*(pointer *)
                             ((long)&(local_d8->cameras).
                                     super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                                     ._M_impl.super__Vector_impl_data + 8));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  (local_88->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  (local_88->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_d0;
  SVar13.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar13.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88;
  return (SP)SVar13.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

LightSource::SP SemanticParser::createLightSource_infinite
  (pbrt::syntactic::LightSource::SP in)
  {
    InfiniteLightSource::SP light = std::make_shared<InfiniteLightSource>();
    // const std::string mapName = in->getParamString("mapname");
    // if (mapName == "")
    //   std::cerr << "warning: no 'mapname' in infinite lightsource!?" << std::endl;
    
    light->transform = in->transform.atStart;
    // light->mapName = mapName;

    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "mapname") {
        light->mapName = in->getParamString(name);
        continue;
      }
      if (name == "L") {
        in->getParam3f(&light->L.x,name);
        continue;
      }
      if (name == "scale") {
        in->getParam3f(&light->scale.x,name);
        continue;
      }
      if (name == "nsamples") {
        light->nSamples = in->getParam1i(name,light->nSamples);
        continue;
      }
      throw std::runtime_error("unknown 'infinite' light source param '"+name+"'");
    }

    std::cout << "found infinite light source w/ map " << light->mapName << std::endl;
    return light;
  }